

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner2.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::IGXMLScanner::updateNSMap
          (IGXMLScanner *this,XMLCh *attrName,XMLCh *attrValue,int colonOfs)

{
  XMLBufferMgr *this_00;
  XMLCh XVar1;
  XMLCh XVar2;
  XMLCh *pXVar3;
  XMLStringPool *pXVar4;
  uint uriId;
  XMLBuffer *toFill;
  XMLCh *pXVar5;
  XMLCh *pXVar6;
  Codes CVar7;
  XMLCh *prefixToAdd;
  XMLBufBid bbNormal;
  
  this_00 = &(this->super_XMLScanner).fBufMgr;
  toFill = XMLBufferMgr::bidOnBuffer(this_00);
  normalizeAttRawValue(this,attrName,attrValue,toFill);
  pXVar3 = toFill->fBuffer;
  pXVar3[toFill->fIndex] = L'\0';
  if (colonOfs == -1) {
    prefixToAdd = L"";
  }
  else {
    prefixToAdd = attrName + (long)colonOfs + 1;
    CVar7 = NoUseOfxmlnsAsPrefix;
    if (prefixToAdd == L"xmlns") goto LAB_002aed70;
    pXVar5 = L"xmlns";
    pXVar6 = prefixToAdd;
    if (prefixToAdd == (XMLCh *)0x0) {
LAB_002aece1:
      if (*pXVar5 == L'\0') goto LAB_002aed70;
    }
    else {
      do {
        XVar1 = *pXVar6;
        if (XVar1 == L'\0') goto LAB_002aece1;
        XVar2 = *pXVar5;
        pXVar5 = pXVar5 + 1;
        pXVar6 = pXVar6 + 1;
      } while (XVar1 == XVar2);
    }
    if (prefixToAdd == L"xml") {
      if (pXVar3 != L"http://www.w3.org/XML/1998/namespace") {
LAB_002aed37:
        pXVar5 = L"http://www.w3.org/XML/1998/namespace";
        pXVar6 = pXVar3;
        if (pXVar3 == (XMLCh *)0x0) {
LAB_002aed65:
          CVar7 = PrefixXMLNotMatchXMLURI;
          if (*pXVar5 == L'\0') goto LAB_002aed78;
        }
        else {
          do {
            XVar1 = *pXVar6;
            if (XVar1 == L'\0') goto LAB_002aed65;
            XVar2 = *pXVar5;
            pXVar5 = pXVar5 + 1;
            pXVar6 = pXVar6 + 1;
          } while (XVar1 == XVar2);
          CVar7 = PrefixXMLNotMatchXMLURI;
        }
LAB_002aed70:
        XMLScanner::emitError(&this->super_XMLScanner,CVar7);
      }
    }
    else {
      pXVar5 = L"xml";
      pXVar6 = prefixToAdd;
      if (prefixToAdd == (XMLCh *)0x0) {
LAB_002aed1d:
        if ((pXVar3 != L"http://www.w3.org/XML/1998/namespace") && (*pXVar5 == L'\0'))
        goto LAB_002aed37;
      }
      else {
        do {
          XVar1 = *pXVar6;
          if (XVar1 == L'\0') goto LAB_002aed1d;
          XVar2 = *pXVar5;
          pXVar5 = pXVar5 + 1;
          pXVar6 = pXVar6 + 1;
        } while (XVar1 == XVar2);
      }
    }
LAB_002aed78:
    if ((pXVar3 == (XMLCh *)0x0) ||
       ((*pXVar3 == L'\0' && ((this->super_XMLScanner).fXMLVersion == XMLV1_0)))) {
      XMLScanner::emitError
                (&this->super_XMLScanner,NoEmptyStrNamespace,attrName,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
  }
  CVar7 = NoUseOfxmlnsURI;
  if (pXVar3 != L"http://www.w3.org/2000/xmlns/") {
    pXVar5 = L"http://www.w3.org/2000/xmlns/";
    pXVar6 = pXVar3;
    if (pXVar3 == (XMLCh *)0x0) {
LAB_002aede0:
      if (*pXVar5 == L'\0') goto LAB_002aee6f;
    }
    else {
      do {
        XVar1 = *pXVar6;
        if (XVar1 == L'\0') goto LAB_002aede0;
        XVar2 = *pXVar5;
        pXVar5 = pXVar5 + 1;
        pXVar6 = pXVar6 + 1;
      } while (XVar1 == XVar2);
    }
    if (pXVar3 == L"http://www.w3.org/XML/1998/namespace") {
      if (prefixToAdd == L"xml") goto LAB_002aee77;
    }
    else {
      pXVar5 = L"http://www.w3.org/XML/1998/namespace";
      pXVar6 = pXVar3;
      if (pXVar3 != (XMLCh *)0x0) {
        do {
          XVar1 = *pXVar6;
          if (XVar1 == L'\0') goto LAB_002aee1c;
          XVar2 = *pXVar5;
          pXVar5 = pXVar5 + 1;
          pXVar6 = pXVar6 + 1;
        } while (XVar1 == XVar2);
        goto LAB_002aee77;
      }
LAB_002aee1c:
      if ((prefixToAdd == L"xml") || (*pXVar5 != L'\0')) goto LAB_002aee77;
    }
    pXVar5 = L"xml";
    pXVar6 = prefixToAdd;
    if (prefixToAdd == (XMLCh *)0x0) {
LAB_002aee64:
      CVar7 = XMLURINotMatchXMLPrefix;
      if (*pXVar5 == L'\0') goto LAB_002aee77;
    }
    else {
      do {
        XVar1 = *pXVar6;
        if (XVar1 == L'\0') goto LAB_002aee64;
        XVar2 = *pXVar5;
        pXVar5 = pXVar5 + 1;
        pXVar6 = pXVar6 + 1;
      } while (XVar1 == XVar2);
      CVar7 = XMLURINotMatchXMLPrefix;
    }
  }
LAB_002aee6f:
  XMLScanner::emitError(&this->super_XMLScanner,CVar7);
LAB_002aee77:
  pXVar4 = (this->super_XMLScanner).fURIStringPool;
  uriId = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])(pXVar4,pXVar3);
  ElemStack::addPrefix(&(this->super_XMLScanner).fElemStack,prefixToAdd,uriId);
  XMLBufferMgr::releaseBuffer(this_00,toFill);
  return;
}

Assistant:

void IGXMLScanner::updateNSMap(const  XMLCh* const    attrName
                            , const XMLCh* const    attrValue
                            , const int colonOfs)
{
    // We need a buffer to normalize the attribute value into
    XMLBufBid bbNormal(&fBufMgr);
    XMLBuffer& normalBuf = bbNormal.getBuffer();

    //  Normalize the value into the passed buffer. In this case, we don't
    //  care about the return value. An error was issued for the error, which
    //  is all we care about here.
    normalizeAttRawValue(attrName, attrValue, normalBuf);
    XMLCh* namespaceURI = normalBuf.getRawBuffer();

    //  We either have the default prefix (""), or we point it into the attr
    //  name parameter. Note that the xmlns is not the prefix we care about
    //  here. To us, the 'prefix' is really the local part of the attrName
    //  parameter.
    //
    //  Check 1. xxx is not xmlns
    //        2. if xxx is xml, then yyy must match XMLUni::fgXMLURIName, and vice versa
    //        3. yyy is not XMLUni::fgXMLNSURIName
    //        4. if xxx is not null, then yyy cannot be an empty string.
    const XMLCh* prefPtr = XMLUni::fgZeroLenString;
    if (colonOfs != -1) {
        prefPtr = &attrName[colonOfs + 1];

        if (XMLString::equals(prefPtr, XMLUni::fgXMLNSString))
            emitError(XMLErrs::NoUseOfxmlnsAsPrefix);
        else if (XMLString::equals(prefPtr, XMLUni::fgXMLString)) {
            if (!XMLString::equals(namespaceURI, XMLUni::fgXMLURIName))
                emitError(XMLErrs::PrefixXMLNotMatchXMLURI);
        }

        if (!namespaceURI)
            emitError(XMLErrs::NoEmptyStrNamespace, attrName);
        else if(!*namespaceURI && fXMLVersion == XMLReader::XMLV1_0)
            emitError(XMLErrs::NoEmptyStrNamespace, attrName);
    }

    if (XMLString::equals(namespaceURI, XMLUni::fgXMLNSURIName))
        emitError(XMLErrs::NoUseOfxmlnsURI);
    else if (XMLString::equals(namespaceURI, XMLUni::fgXMLURIName)) {
        if (!XMLString::equals(prefPtr, XMLUni::fgXMLString))
            emitError(XMLErrs::XMLURINotMatchXMLPrefix);
    }

    //  Ok, we have to get the unique id for the attribute value, which is the
    //  URI that this value should be mapped to. The validator has the
    //  namespace string pool, so we ask him to find or add this new one. Then
    //  we ask the element stack to add this prefix to URI Id mapping.
    fElemStack.addPrefix
    (
        prefPtr
        , fURIStringPool->addOrFind(namespaceURI)
    );
}